

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenIsPresent_Test::
~CoapTest_CoapMessageHeader_TokenIsPresent_Test
          (CoapTest_CoapMessageHeader_TokenIsPresent_Test *this)

{
  CoapTest_CoapMessageHeader_TokenIsPresent_Test *this_local;
  
  ~CoapTest_CoapMessageHeader_TokenIsPresent_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenIsPresent)
{
    ByteArray buffer{0x41, 0x00, 0x00, 0x00, 0xfa};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetToken(), ByteArray{0xfa});
}